

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::compress_alpha_block
               (dxt5_block *pDXT5_block,color_quad_u8 *pBlock,uint comp_index)

{
  uint uVar1;
  uint local_54;
  uint8 *puStack_50;
  uint i;
  uint8 *pDst;
  uint bits;
  uint mask;
  uint high8;
  uint low8;
  uint8 selectors [16];
  uint comp_index_local;
  color_quad_u8 *pBlock_local;
  dxt5_block *pDXT5_block_local;
  
  compress_alpha_block(0x10,pBlock,&mask,&bits,(uint8 *)&high8,comp_index);
  dxt5_block::set_low_alpha(pDXT5_block,mask);
  dxt5_block::set_high_alpha(pDXT5_block,bits);
  pDst._4_4_ = 0;
  pDst._0_4_ = 0;
  puStack_50 = pDXT5_block->m_selectors;
  for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
    pDst._4_4_ = (uint)*(byte *)((long)&high8 + (ulong)local_54) << ((byte)(uint)pDst & 0x1f) |
                 pDst._4_4_;
    uVar1 = (uint)pDst + 3;
    if (7 < (uint)pDst + 3) {
      *puStack_50 = (uint8)pDst._4_4_;
      pDst._4_4_ = pDst._4_4_ >> 8;
      puStack_50 = puStack_50 + 1;
      uVar1 = (uint)pDst - 5;
    }
    pDst._0_4_ = uVar1;
  }
  return;
}

Assistant:

void compress_alpha_block(dxt5_block* pDXT5_block, const color_quad_u8* pBlock, uint comp_index)
        {
            uint8 selectors[16];
            uint low8, high8;

            compress_alpha_block(16, pBlock, low8, high8, selectors, comp_index);

            pDXT5_block->set_low_alpha(low8);
            pDXT5_block->set_high_alpha(high8);

            uint mask = 0;
            uint bits = 0;
            uint8* pDst = pDXT5_block->m_selectors;

            for (uint i = 0; i < 16; i++)
            {
                mask |= (selectors[i] << bits);

                if ((bits += 3) >= 8)
                {
                    *pDst++ = static_cast<uint8>(mask);
                    mask >>= 8;
                    bits -= 8;
                }
            }
        }